

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool parse_cpu_range(string *range,bool (*boolmask) [512])

{
  long lVar1;
  common_log *pcVar2;
  long lVar3;
  long in_RSI;
  ulong in_RDI;
  size_t i;
  size_t end_i;
  size_t start_i;
  size_t dash_loc;
  size_t *in_stack_ffffffffffffff48;
  string *__idx;
  string *in_stack_ffffffffffffff50;
  ulong local_88;
  string local_80 [48];
  string local_50 [32];
  ulong local_30;
  ulong local_28;
  long local_20;
  long local_18;
  ulong local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = std::__cxx11::string::find((char)in_RDI,0x2d);
  if (local_20 == -1) {
    if (-1 < common_log_verbosity_thold) {
      pcVar2 = common_log_main();
      common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,
                     "Format of CPU range is invalid! Expected [<start>]-[<end>].\n");
    }
    local_1 = false;
  }
  else {
    if (local_20 == 0) {
      local_28 = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,local_10);
      local_28 = std::__cxx11::stoull(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
      std::__cxx11::string::~string(local_50);
      if (0x1ff < local_28) {
        if (-1 < common_log_verbosity_thold) {
          pcVar2 = common_log_main();
          common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,"Start index out of bounds!\n");
        }
        return false;
      }
    }
    lVar1 = local_20;
    lVar3 = std::__cxx11::string::length();
    if (lVar1 == lVar3 + -1) {
      local_30 = 0x1ff;
    }
    else {
      __idx = local_80;
      std::__cxx11::string::substr((ulong)__idx,local_10);
      local_30 = std::__cxx11::stoull(in_stack_ffffffffffffff50,(size_t *)__idx,0);
      std::__cxx11::string::~string(local_80);
      if (0x1ff < local_30) {
        if (-1 < common_log_verbosity_thold) {
          pcVar2 = common_log_main();
          common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,"End index out of bounds!\n");
        }
        return false;
      }
    }
    for (local_88 = local_28; local_88 <= local_30; local_88 = local_88 + 1) {
      *(undefined1 *)(local_18 + local_88) = 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool parse_cpu_range(const std::string & range, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    size_t dash_loc = range.find('-');
    if (dash_loc == std::string::npos) {
        LOG_ERR("Format of CPU range is invalid! Expected [<start>]-[<end>].\n");
        return false;
    }

    size_t start_i;
    size_t end_i;

    if (dash_loc == 0) {
        start_i = 0;
    } else {
        start_i = std::stoull(range.substr(0, dash_loc));
        if (start_i >= GGML_MAX_N_THREADS) {
            LOG_ERR("Start index out of bounds!\n");
            return false;
        }
    }

    if (dash_loc == range.length() - 1) {
        end_i = GGML_MAX_N_THREADS - 1;
    } else {
        end_i = std::stoull(range.substr(dash_loc + 1));
        if (end_i >= GGML_MAX_N_THREADS) {
            LOG_ERR("End index out of bounds!\n");
            return false;
        }
    }

    for (size_t i = start_i; i <= end_i; i++) {
        boolmask[i] = true;
    }

    return true;
}